

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

int fy_node_sort(fy_node *fyn,fy_node_mapping_sort_fn key_cmp,void *arg)

{
  fy_node *pfVar1;
  fy_token *pfVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  fy_token *pfVar6;
  fy_node *fyn_00;
  fy_token *pfVar7;
  
  iVar4 = 0;
  if (fyn != (fy_node *)0x0) {
    bVar3 = fyn->field_0x34 & 3;
    if (bVar3 == 2) {
      iVar4 = fy_node_mapping_sort(fyn,key_cmp,arg);
      if (iVar4 == 0) {
        iVar4 = 0;
        pfVar7 = (fy_token *)0x0;
        if ((fyn->field_12).scalar != (fy_token *)&fyn->field_12) {
          pfVar7 = (fyn->field_12).scalar;
        }
        while (pfVar7 != (fy_token *)0x0) {
          pfVar2 = (fy_token *)(pfVar7->node).next;
          pfVar6 = (fy_token *)0x0;
          if (pfVar2 != (fy_token *)&fyn->field_12) {
            pfVar6 = pfVar2;
          }
          iVar5 = fy_node_sort(*(fy_node **)&pfVar7->type,key_cmp,arg);
          if (iVar5 != 0) {
            return iVar5;
          }
          iVar5 = fy_node_sort(*(fy_node **)&pfVar7->analyze_flags,key_cmp,arg);
          if (iVar5 != 0) {
            return iVar5;
          }
          pfVar7->text = (char *)fyn;
          pfVar7 = pfVar6;
        }
      }
      else {
        iVar4 = -1;
      }
    }
    else if (bVar3 == 1) {
      fyn_00 = (fy_node *)&fyn->field_12;
      while( true ) {
        pfVar1 = (fy_node *)(fyn_00->node).next;
        iVar4 = 0;
        fyn_00 = (fy_node *)0x0;
        if (pfVar1 != (fy_node *)&fyn->field_12) {
          fyn_00 = pfVar1;
        }
        if (fyn_00 == (fy_node *)0x0) break;
        fy_node_sort(fyn_00,key_cmp,arg);
      }
    }
  }
  return iVar4;
}

Assistant:

int fy_node_sort(struct fy_node *fyn, fy_node_mapping_sort_fn key_cmp, void *arg) {
    struct fy_node *fyni;
    struct fy_node_pair *fynp, *fynpi;
    int ret;

    if (!fyn)
        return 0;

    switch (fyn->type) {
        case FYNT_SCALAR:
            break;

        case FYNT_SEQUENCE:
            for (fyni = fy_node_list_head(&fyn->sequence); fyni;
                 fyni = fy_node_next(&fyn->sequence, fyni)) {

                fy_node_sort(fyni, key_cmp, arg);
            }
            break;

        case FYNT_MAPPING:
            ret = fy_node_mapping_sort(fyn, key_cmp, arg);
            if (ret)
                return ret;

            for (fynp = fy_node_pair_list_head(&fyn->mapping); fynp; fynp = fynpi) {

                fynpi = fy_node_pair_next(&fyn->mapping, fynp);

                /* the parent of the key is always NULL */
                ret = fy_node_sort(fynp->key, key_cmp, arg);
                if (ret)
                    return ret;

                ret = fy_node_sort(fynp->value, key_cmp, arg);
                if (ret)
                    return ret;

                fynp->parent = fyn;
            }
            break;
    }

    return 0;
}